

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSAPrivateKey.cpp
# Opt level: O0

bool __thiscall RSAPrivateKey::deserialise(RSAPrivateKey *this,ByteString *serialised)

{
  size_t sVar1;
  ByteString *in_RDI;
  ByteString dE;
  ByteString dN;
  ByteString dD;
  ByteString dDQ1;
  ByteString dDP1;
  ByteString dPQ;
  ByteString dQ;
  ByteString dP;
  undefined1 local_168 [40];
  undefined1 local_140 [40];
  undefined1 local_118 [40];
  undefined1 local_f0 [40];
  undefined1 local_c8 [40];
  undefined1 local_a0 [56];
  undefined1 local_68 [40];
  undefined1 local_40 [63];
  byte local_1;
  
  ByteString::chainDeserialise(in_RDI);
  ByteString::chainDeserialise(in_RDI);
  ByteString::chainDeserialise(in_RDI);
  ByteString::chainDeserialise(in_RDI);
  ByteString::chainDeserialise(in_RDI);
  ByteString::chainDeserialise(in_RDI);
  ByteString::chainDeserialise(in_RDI);
  ByteString::chainDeserialise(in_RDI);
  sVar1 = ByteString::size((ByteString *)0x150f61);
  if (sVar1 != 0) {
    sVar1 = ByteString::size((ByteString *)0x150f7d);
    if (sVar1 != 0) {
      sVar1 = ByteString::size((ByteString *)0x150f99);
      if (sVar1 != 0) {
        (*in_RDI->_vptr_ByteString[8])(in_RDI,local_40);
        (*in_RDI->_vptr_ByteString[9])(in_RDI,local_68);
        (*in_RDI->_vptr_ByteString[10])(in_RDI,local_a0);
        (*in_RDI->_vptr_ByteString[0xb])(in_RDI,local_c8);
        (*in_RDI->_vptr_ByteString[0xc])(in_RDI,local_f0);
        (*in_RDI->_vptr_ByteString[0xd])(in_RDI,local_118);
        (*in_RDI->_vptr_ByteString[0xe])(in_RDI,local_140);
        (*in_RDI->_vptr_ByteString[0xf])(in_RDI,local_168);
        local_1 = 1;
        goto LAB_00151160;
      }
    }
  }
  local_1 = 0;
LAB_00151160:
  ByteString::~ByteString((ByteString *)0x15116a);
  ByteString::~ByteString((ByteString *)0x151174);
  ByteString::~ByteString((ByteString *)0x151181);
  ByteString::~ByteString((ByteString *)0x15118e);
  ByteString::~ByteString((ByteString *)0x15119b);
  ByteString::~ByteString((ByteString *)0x1511a8);
  ByteString::~ByteString((ByteString *)0x1511b5);
  ByteString::~ByteString((ByteString *)0x1511c2);
  return (bool)(local_1 & 1);
}

Assistant:

bool RSAPrivateKey::deserialise(ByteString& serialised)
{
	ByteString dP = ByteString::chainDeserialise(serialised);
	ByteString dQ = ByteString::chainDeserialise(serialised);
	ByteString dPQ = ByteString::chainDeserialise(serialised);
	ByteString dDP1 = ByteString::chainDeserialise(serialised);
	ByteString dDQ1 = ByteString::chainDeserialise(serialised);
	ByteString dD = ByteString::chainDeserialise(serialised);
	ByteString dN = ByteString::chainDeserialise(serialised);
	ByteString dE = ByteString::chainDeserialise(serialised);

	if ((dD.size() == 0) ||
	    (dN.size() == 0) ||
	    (dE.size() == 0))
	{
		return false;
	}

	setP(dP);
	setQ(dQ);
	setPQ(dPQ);
	setDP1(dDP1);
	setDQ1(dDQ1);
	setD(dD);
	setN(dN);
	setE(dE);

	return true;
}